

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2AddrModeSOReg(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar2;
  uint uVar3;
  DecodeStatus DVar4;
  uint imm;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  Rm = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Val,6,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,2,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,2);
  uVar3 = MCInst_getOpcode(pMStack_18);
  if ((((uVar3 == 0xa2d) || (uVar3 == 0xa3b)) || (uVar3 == 0xa42)) && (RegNo == 0xf)) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    DVar4 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&Rm,DVar4);
    if (_Var1) {
      DVar4 = DecoderGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&Rm,DVar4);
      if (_Var1) {
        MCOperand_CreateImm0(pMStack_18,(ulong)uVar2);
        Inst_local._4_4_ = Rm;
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2AddrModeSOReg(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 6, 4);
	unsigned Rm = fieldFromInstruction_4(Val, 2, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 2);

	// Thumb stores cannot use PC as dest register.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2STRHs:
		case ARM_t2STRBs:
		case ARM_t2STRs:
			if (Rn == 15)
				return MCDisassembler_Fail;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, imm);

	return S;
}